

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadObject(CoronaLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 in_RDX;
  XML *in_RDI;
  FileName fileName;
  bool in_stack_0000014f;
  FileName *in_stack_00000150;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  XML *this_01;
  FileName *in_stack_fffffffffffffeb0;
  FileName *in_stack_fffffffffffffeb8;
  Ref<embree::XML> *in_stack_fffffffffffffed8;
  CoronaLoader *in_stack_fffffffffffffee0;
  ParseLocation *in_stack_fffffffffffffef8;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [35];
  undefined1 local_85;
  string local_58 [32];
  undefined8 local_38;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  this_01 = in_RDI;
  local_38 = in_RDX;
  bVar1 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  if (bVar1) {
    local_85 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_10 = local_38;
    ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffef8);
    std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
    std::runtime_error::runtime_error(this_00,local_58);
    local_85 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_18 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"class",&local_c9);
  XML::parm(this_01,(string *)in_RDI);
  bVar1 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if (!bVar1) {
    load<embree::FileName>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    embree::FileName::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    SceneGraph::load(in_stack_00000150,in_stack_0000014f);
    embree::FileName::~FileName((FileName *)0x464918);
    embree::FileName::~FileName((FileName *)0x464925);
    return (Ref<embree::SceneGraph::Node>)(Node *)this_01;
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  local_20 = local_38;
  ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffef8);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe50);
  std::runtime_error::runtime_error((runtime_error *)__lhs,local_f0);
  __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadObject(const Ref<XML>& xml) 
  {
    if (xml->name != "object") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid object node");
    if (xml->parm("class") != "file")
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid object class");
    const FileName fileName = load<FileName>(xml);
    return SceneGraph::load(path+fileName);
  }